

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point3f __thiscall pbrt::detail::Hammersley3DIter::operator*(Hammersley3DIter *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_ZMM3 [64];
  Point3f PVar10;
  
  iVar1 = (this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).i;
  uVar3 = (ulong)iVar1;
  auVar8 = ZEXT816(0) << 0x40;
  auVar7 = ZEXT816(0) << 0x40;
  if (uVar3 != 0) {
    fVar6 = 1.0;
    lVar4 = 0;
    uVar2 = uVar3;
    do {
      lVar4 = (lVar4 - uVar2 / 2) * 2 + uVar2;
      fVar6 = fVar6 * 0.5;
      bVar5 = 1 < uVar2;
      uVar2 = uVar2 / 2;
    } while (bVar5);
    auVar7 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,lVar4);
    auVar7 = ZEXT416((uint)(fVar6 * auVar7._0_4_));
  }
  auVar9._4_12_ = in_ZMM3._4_12_;
  if (iVar1 != 0) {
    fVar6 = 1.0;
    lVar4 = 0;
    do {
      lVar4 = (lVar4 - uVar3 / 3) * 3 + uVar3;
      fVar6 = fVar6 * 0.33333334;
      bVar5 = 2 < uVar3;
      uVar3 = uVar3 / 3;
    } while (bVar5);
    auVar8 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,lVar4);
    auVar8 = ZEXT416((uint)(fVar6 * auVar8._0_4_));
  }
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
  auVar9._0_4_ = (float)iVar1 /
                 (float)(this->super_IndexingIterator<pbrt::detail::Hammersley3DIter>).n;
  auVar7 = vinsertps_avx(auVar9,auVar7,0x10);
  auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar8);
  PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
  PVar10.super_Tuple3<pbrt::Point3,_float>.z = auVar8._0_4_;
  return (Point3f)PVar10.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        return {Float(i) / Float(n), RadicalInverse(0, i), RadicalInverse(1, i)};
    }